

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool trans_MLS(DisasContext_conflict1 *s,arg_MLS *a)

{
  int iVar1;
  ulong uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGv_i32 var;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  TCGv_i32 pTVar6;
  
  uVar2 = s->features;
  if ((uVar2 & 0x40) != 0) {
    s_00 = s->uc->tcg_ctx;
    iVar1 = a->rn;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)pTVar4 - (long)s_00);
    load_reg_var(s,var,iVar1);
    iVar1 = a->rm;
    pTVar3 = s->uc->tcg_ctx;
    pTVar5 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
    pTVar6 = (TCGv_i32)((long)pTVar5 - (long)pTVar3);
    load_reg_var(s,pTVar6,iVar1);
    pTVar5 = (TCGTemp *)(pTVar6 + (long)s_00);
    tcg_gen_op3_aarch64(s_00,INDEX_op_mul_i32,(TCGArg)pTVar4,(TCGArg)pTVar4,(TCGArg)pTVar5);
    tcg_temp_free_internal_aarch64(s_00,pTVar5);
    iVar1 = a->ra;
    pTVar3 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
    pTVar6 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
    load_reg_var(s,pTVar6,iVar1);
    tcg_gen_sub_i32(s_00,var,pTVar6,var);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar6 + (long)s_00));
    store_reg(s,a->rd,var);
  }
  return SUB41(((uint)uVar2 & 0x40) >> 6,0);
}

Assistant:

static bool trans_MLS(DisasContext *s, arg_MLS *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2;

    if (!ENABLE_ARCH_6T2) {
        return false;
    }
    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    tcg_gen_mul_i32(tcg_ctx, t1, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t2);
    t2 = load_reg(s, a->ra);
    tcg_gen_sub_i32(tcg_ctx, t1, t2, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}